

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

uint32_t ogt_vox_sample_anim_model(ogt_vox_anim_model *anim,uint32_t frame_index)

{
  ogt_vox_keyframe_model *poVar1;
  uint uVar2;
  ulong uVar3;
  
  if (anim->num_keyframes == 0) {
    __assert_fail("(anim->num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x518,"uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)")
    ;
  }
  if (anim->loop == true) {
    frame_index = compute_looped_frame_index
                            (anim->keyframes->frame_index,
                             anim->keyframes[anim->num_keyframes - 1].frame_index,frame_index);
  }
  poVar1 = anim->keyframes;
  if (poVar1->frame_index < frame_index) {
    uVar3 = (ulong)(anim->num_keyframes - 1);
    if (frame_index < poVar1[uVar3].frame_index) {
      if (1 < (int)anim->num_keyframes) {
        do {
          uVar2 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar2;
          if (poVar1[uVar3].frame_index <= frame_index) {
            poVar1 = poVar1 + uVar3;
            goto LAB_0010378c;
          }
        } while (0 < (int)uVar2);
      }
      __assert_fail("(0) && (\"shouldn\'t reach here\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x525,
                    "uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)");
    }
    poVar1 = poVar1 + uVar3;
  }
LAB_0010378c:
  return poVar1->model_index;
}

Assistant:

uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model* anim, uint32_t frame_index)
    {
        ogt_assert(anim->num_keyframes >= 1, "need at least one keyframe to sample");
        if (anim->loop) {
            frame_index = compute_looped_frame_index(anim->keyframes[0].frame_index, anim->keyframes[anim->num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= anim->keyframes[0].frame_index)
            return anim->keyframes[0].model_index;
        if (frame_index >=anim-> keyframes[anim->num_keyframes-1].frame_index)
            return anim->keyframes[anim->num_keyframes-1].model_index;
        for (int32_t f = (int32_t)anim->num_keyframes-2; f >= 0; f--) {
            if (frame_index >= anim->keyframes[f].frame_index) {
                return anim->keyframes[f+0].model_index;
            }
        }
        ogt_assert(0, "shouldn't reach here");
        return anim->keyframes[0].model_index;
    }